

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  FieldGeneratorMap *this_00;
  bool bVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  LogMessage *pLVar4;
  OneofDescriptor *pOVar5;
  Descriptor *pDVar6;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  char *pcVar7;
  size_type in_R9;
  FieldDescriptor *pFVar8;
  StringPiece has_bits_var;
  Formatter format;
  uint local_10c;
  Iterator __end3;
  Iterator __begin3;
  Iterator __begin3_1;
  Iterator __end3_2;
  bool local_78 [8];
  char *local_70;
  Formatter local_68;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\x01') {
    Formatter::operator()<>
              (&format,
               "$classname$::$classname$() {}\n$classname$::$classname$(::$proto_ns$::Arena* arena)\n    : SuperType(arena) {}\nvoid $classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n"
              );
    bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_);
    if (bVar1) {
      pcVar7 = 
      "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
      ;
      if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\0') {
        pcVar7 = 
        "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
        ;
      }
      Formatter::operator()(&format,pcVar7,&this->index_in_file_messages_);
    }
  }
  else {
    options = &this->options_;
    bVar1 = IsAnyMessage(this->descriptor_,options);
    if (bVar1) {
      bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
      if (bVar1) {
        Formatter::operator()<>
                  (&format,
                   "bool $classname$::GetAnyFieldDescriptors(\n    const ::$proto_ns$::Message& message,\n    const ::$proto_ns$::FieldDescriptor** type_url_field,\n    const ::$proto_ns$::FieldDescriptor** value_field) {\n  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n      message, type_url_field, value_field);\n}\n"
                  );
      }
      Formatter::operator()<>
                (&format,
                 "bool $classname$::ParseAnyTypeUrl(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n    std::string* full_type_name) {\n  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n                                             full_type_name);\n}\n\n"
                );
    }
    Formatter::operator()<>(&format,"class $classname$::_Internal {\n public:\n");
    io::Printer::Indent(format.printer_);
    if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>
                (&format,"using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
    }
    __end3.descriptor = this->descriptor_;
    __begin3.idx = 0;
    __end3.idx = *(int *)(__end3.descriptor + 4);
    this_00 = &this->field_generators_;
    __begin3.descriptor = __end3.descriptor;
    while( true ) {
      bVar1 = operator!=(&__begin3,&__end3);
      if (!bVar1) break;
      pFVar8 = (FieldDescriptor *)
               ((long)__begin3.idx * 0x48 + *(long *)(__begin3.descriptor + 0x28));
      pFVar3 = FieldGeneratorMap::get(this_00,pFVar8);
      (*pFVar3->_vptr_FieldGenerator[9])(pFVar3,printer);
      bVar1 = HasHasbit(pFVar8);
      if (bVar1) {
        iVar2 = HasBitIndex(this,pFVar8);
        field = extraout_RDX;
        if (iVar2 == -1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&__begin3_1,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x943);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)&__begin3_1,
                              "CHECK failed: (has_bit_index) != (kNoHasbit): ");
          pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)(*(long *)(pFVar8 + 8) + 0x20))
          ;
          internal::LogFinisher::operator=((LogFinisher *)&__end3_2,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)&__begin3_1);
          field = extraout_RDX_00;
        }
        FieldName_abi_cxx11_((string *)&__begin3_1,(cpp *)pFVar8,field);
        __end3_2.idx = iVar2 / 0x20;
        local_10c = 1 << ((byte)iVar2 & 0x1f);
        Formatter::operator()
                  (&format,
                   "static void set_has_$1$(HasBits* has_bits) {\n  (*has_bits)[$2$] |= $3$u;\n}\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3_1,
                   &__end3_2.idx,&local_10c);
        std::__cxx11::string::~string((string *)&__begin3_1);
      }
      __begin3.idx = __begin3.idx + 1;
    }
    if (0 < this->num_required_fields_) {
      RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin3,this);
      stringpiece_internal::StringPiece::StringPiece((StringPiece *)local_78,"has_bits");
      has_bits_var.length_ = in_R9;
      has_bits_var.ptr_ = local_70;
      (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                ((string *)&__begin3_1,(_anonymous_namespace_ *)&__begin3,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,local_78[0],has_bits_var
                );
      Formatter::operator()
                (&format,
                 "static bool MissingRequiredFields(const HasBits& has_bits) {\n  return $1$;\n}\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3_1);
      std::__cxx11::string::~string((string *)&__begin3_1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin3);
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"};\n\n");
    __begin3.descriptor = this->descriptor_;
    __begin3_1.idx = 0;
    __begin3.idx = *(int *)(__begin3.descriptor + 4);
    __begin3_1.descriptor = __begin3.descriptor;
    while( true ) {
      bVar1 = operator!=(&__begin3_1,&__begin3);
      if (!bVar1) break;
      pFVar3 = FieldGeneratorMap::get
                         (this_00,(FieldDescriptor *)
                                  ((long)__begin3_1.idx * 0x48 +
                                  *(long *)(__begin3_1.descriptor + 0x28)));
      (*pFVar3->_vptr_FieldGenerator[8])(pFVar3,printer);
      __begin3_1.idx = __begin3_1.idx + 1;
    }
    __end3.descriptor = this->descriptor_;
    __end3.idx = 0;
    __end3_2.idx = *(int *)(__end3.descriptor + 4);
    __end3_2.descriptor = __end3.descriptor;
    while( true ) {
      bVar1 = operator!=(&__end3,&__end3_2);
      if (!bVar1) break;
      pFVar8 = (FieldDescriptor *)((long)__end3.idx * 0x48 + *(long *)(__end3.descriptor + 0x28));
      pFVar3 = FieldGeneratorMap::get(this_00,pFVar8);
      (*pFVar3->_vptr_FieldGenerator[7])(pFVar3,printer);
      bVar1 = anon_unknown_0::IsCrossFileMaybeMap(pFVar8);
      if (bVar1) {
        Formatter::SaveState::SaveState((SaveState *)&__begin3_1,&format);
        __begin3.descriptor = (Descriptor *)((ulong)__begin3.descriptor & 0xffffffff00000000);
        SetCommonFieldVariables
                  (pFVar8,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__begin3,options);
        pOVar5 = FieldDescriptor::real_containing_oneof(pFVar8);
        if (pOVar5 != (OneofDescriptor *)0x0) {
          SetCommonOneofFieldVariables
                    (pFVar8,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__begin3);
        }
        Formatter::AddMap(&format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&__begin3);
        Formatter::Formatter(&local_68,&format);
        GenerateFieldClear(this,pFVar8,false,&local_68);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_68.vars_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__begin3);
        Formatter::SaveState::~SaveState((SaveState *)&__begin3_1);
      }
      __end3.idx = __end3.idx + 1;
    }
    GenerateStructors(this,printer);
    Formatter::operator()<>(&format,"\n");
    pDVar6 = this->descriptor_;
    if (0 < *(int *)(pDVar6 + 0x6c)) {
      GenerateOneofClear(this,printer);
      Formatter::operator()<>(&format,"\n");
      pDVar6 = this->descriptor_;
    }
    bVar1 = HasGeneratedMethods(*(FileDescriptor **)(pDVar6 + 0x10),options);
    if (bVar1) {
      GenerateClear(this,printer);
      Formatter::operator()<>(&format,"\n");
      bVar1 = HasSimpleBaseClass(this->descriptor_,options);
      if (!bVar1) {
        ParseFunctionGenerator::GenerateMethodImpls
                  ((this->parse_function_generator_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                   ._M_head_impl,printer);
        Formatter::operator()<>(&format,"\n");
        ParseFunctionGenerator::GenerateDataDefinitions
                  ((this->parse_function_generator_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      GenerateSerializeWithCachedSizesToArray(this,printer);
      Formatter::operator()<>(&format,"\n");
      GenerateByteSize(this,printer);
      Formatter::operator()<>(&format,"\n");
      GenerateMergeFrom(this,printer);
      Formatter::operator()<>(&format,"\n");
      GenerateClassSpecificMergeFrom(this,printer);
      Formatter::operator()<>(&format,"\n");
      GenerateCopyFrom(this,printer);
      Formatter::operator()<>(&format,"\n");
      GenerateIsInitialized(this,printer);
      Formatter::operator()<>(&format,"\n");
    }
    GenerateSwap(this,printer);
    Formatter::operator()<>(&format,"\n");
    if ((this->options_).table_driven_serialization == true) {
      Formatter::operator()
                (&format,
                 "const void* $classname$::InternalGetTable() const {\n  return ::$tablename$::serialization_table + $1$;\n}\n\n"
                 ,&this->index_in_file_messages_);
    }
    bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
    if (bVar1) {
      pcVar7 = 
      "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
      ;
      if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\0') {
        pcVar7 = 
        "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
        ;
      }
      Formatter::operator()(&format,pcVar7,&this->index_in_file_messages_);
      pDVar6 = extraout_RDX_01;
    }
    else {
      Formatter::operator()<>
                (&format,
                 "std::string $classname$::GetTypeName() const {\n  return \"$full_name$\";\n}\n\n")
      ;
      pDVar6 = extraout_RDX_02;
    }
    if (((this->options_).field_listener_options.inject_field_listener_events == true) &&
       (*(int *)(*(long *)(*(long *)((cpp *)this->descriptor_ + 0x10) + 0x78) + 0xa0) != 3)) {
      ClassName_abi_cxx11_((string *)&__begin3_1,(cpp *)this->descriptor_,pDVar6);
      Formatter::operator()
                (&format,
                 "::$proto_ns$::AccessListener<$classtype$> $1$::_tracker_(&FullMessageName);\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3_1);
      std::__cxx11::string::~string((string *)&__begin3_1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (IsMapEntryMessage(descriptor_)) {
    format(
        "$classname$::$classname$() {}\n"
        "$classname$::$classname$(::$proto_ns$::Arena* arena)\n"
        "    : SuperType(arena) {}\n"
        "void $classname$::MergeFrom(const $classname$& other) {\n"
        "  MergeFromInternal(other);\n"
        "}\n");
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      if (!descriptor_->options().map_entry()) {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "$annotate_reflection$"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      } else {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      }
    }
    return;
  }

  if (IsAnyMessage(descriptor_, options_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      format(
          "bool $classname$::GetAnyFieldDescriptors(\n"
          "    const ::$proto_ns$::Message& message,\n"
          "    const ::$proto_ns$::FieldDescriptor** type_url_field,\n"
          "    const ::$proto_ns$::FieldDescriptor** value_field) {\n"
          "  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n"
          "      message, type_url_field, value_field);\n"
          "}\n");
    }
    format(
        "bool $classname$::ParseAnyTypeUrl(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n"
        "    std::string* full_type_name) {\n"
        "  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n"
        "                                             full_type_name);\n"
        "}\n"
        "\n");
  }

  format(
      "class $classname$::_Internal {\n"
      " public:\n");
  format.Indent();
  if (!has_bit_indices_.empty()) {
    format(
        "using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
  }
  for (auto field : FieldRange(descriptor_)) {
    field_generators_.get(field).GenerateInternalAccessorDeclarations(printer);
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      GOOGLE_CHECK_NE(has_bit_index, kNoHasbit) << field->full_name();
      format(
          "static void set_has_$1$(HasBits* has_bits) {\n"
          "  (*has_bits)[$2$] |= $3$u;\n"
          "}\n",
          FieldName(field), has_bit_index / 32, (1u << (has_bit_index % 32)));
    }
  }
  if (num_required_fields_ > 0) {
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format(
        "static bool MissingRequiredFields(const HasBits& has_bits) "
        "{\n"
        "  return $1$;\n"
        "}\n",
        ConditionalToCheckBitmasks(masks_for_has_bits, false, "has_bits"));
  }

  format.Outdent();
  format("};\n\n");
  for (auto field : FieldRange(descriptor_)) {
    if (!IsFieldStripped(field, options_)) {
      field_generators_.get(field).GenerateInternalAccessorDefinitions(printer);
    }
  }

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(printer);
    if (IsCrossFileMaybeMap(field)) {
      Formatter::SaveState saver(&format);
      std::map<std::string, std::string> vars;
      SetCommonFieldVariables(field, &vars, options_);
      if (field->real_containing_oneof()) {
        SetCommonOneofFieldVariables(field, &vars);
      }
      format.AddMap(vars);
      GenerateFieldClear(field, false, format);
    }
  }

  GenerateStructors(printer);
  format("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    format("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    format("\n");

    if (!HasSimpleBaseClass(descriptor_, options_)) {
      parse_function_generator_->GenerateMethodImpls(printer);
      format("\n");

      parse_function_generator_->GenerateDataDefinitions(printer);
    }

    GenerateSerializeWithCachedSizesToArray(printer);
    format("\n");

    GenerateByteSize(printer);
    format("\n");

    GenerateMergeFrom(printer);
    format("\n");

    GenerateClassSpecificMergeFrom(printer);
    format("\n");

    GenerateCopyFrom(printer);
    format("\n");

    GenerateIsInitialized(printer);
    format("\n");
  }

  GenerateVerify(printer);

  GenerateSwap(printer);
  format("\n");

  if (options_.table_driven_serialization) {
    format(
        "const void* $classname$::InternalGetTable() const {\n"
        "  return ::$tablename$::serialization_table + $1$;\n"
        "}\n"
        "\n",
        index_in_file_messages_);
  }
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    if (!descriptor_->options().map_entry()) {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "$annotate_reflection$"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    } else {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    }
  } else {
    format(
        "std::string $classname$::GetTypeName() const {\n"
        "  return \"$full_name$\";\n"
        "}\n"
        "\n");
  }

  if (options_.field_listener_options.inject_field_listener_events &&
      descriptor_->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    format(
        "::$proto_ns$::AccessListener<$classtype$> "
        "$1$::_tracker_(&FullMessageName);\n",
        ClassName(descriptor_));
  }
}